

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O2

void __thiscall
mock_visitor<unsigned_long_long>::mock_visitor(mock_visitor<unsigned_long_long> *this)

{
  MockSpec<test_result_(unsigned_long_long)> *this_00;
  OnCallSpec<test_result_(unsigned_long_long)> *this_01;
  linked_ptr<testing::ActionInterface<test_result_(unsigned_long_long)>_> local_40;
  MatcherBase<unsigned_long_long> local_30;
  
  testing::internal::FunctionMocker<test_result_(unsigned_long_long)>::FunctionMocker
            (&this->gmock1_visit_268);
  testing::internal::FunctionMocker<void_()>::FunctionMocker(&this->gmock0_unexpected_269);
  testing::A<unsigned_long_long>();
  this_00 = gmock_visit(this,(Matcher<unsigned_long_long> *)&local_30);
  this_01 = testing::internal::MockSpec<test_result_(unsigned_long_long)>::
            InternalDefaultActionSetAt
                      (this_00,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
                       ,0x109,"*this","visit(_)");
  local_40.value_ = (ActionInterface<test_result_(unsigned_long_long)> *)operator_new(0x10);
  (local_40.value_)->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_001b8f78;
  local_40.link_.next_ = &local_40.link_;
  testing::internal::OnCallSpec<test_result_(unsigned_long_long)>::WillByDefault
            (this_01,(Action<test_result_(unsigned_long_long)> *)&local_40);
  testing::internal::linked_ptr<testing::ActionInterface<test_result_(unsigned_long_long)>_>::
  ~linked_ptr(&local_40);
  testing::internal::MatcherBase<unsigned_long_long>::~MatcherBase(&local_30);
  return;
}

Assistant:

mock_visitor() {
    ON_CALL(*this, visit(_)).WillByDefault(testing::Return(test_result()));
  }